

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallGetRuntimeDependenciesGenerator.cxx
# Opt level: O0

void anon_unknown.dwarf_f10517::WriteFilesArgument
               (ostream *os,string_view *keyword,
               vector<std::unique_ptr<cmInstallRuntimeDependencySet::Item,_std::default_delete<cmInstallRuntimeDependencySet::Item>_>,_std::allocator<std::unique_ptr<cmInstallRuntimeDependencySet::Item,_std::default_delete<cmInstallRuntimeDependencySet::Item>_>_>_>
               *items,string *config,cmScriptGeneratorIndent indent)

{
  string local_58 [36];
  cmScriptGeneratorIndent local_34;
  string *local_30;
  string *config_local;
  vector<std::unique_ptr<cmInstallRuntimeDependencySet::Item,_std::default_delete<cmInstallRuntimeDependencySet::Item>_>,_std::allocator<std::unique_ptr<cmInstallRuntimeDependencySet::Item,_std::default_delete<cmInstallRuntimeDependencySet::Item>_>_>_>
  *items_local;
  string_view *keyword_local;
  ostream *os_local;
  cmScriptGeneratorIndent indent_local;
  
  local_34.Level = indent.Level;
  local_30 = config;
  config_local = (string *)items;
  items_local = (vector<std::unique_ptr<cmInstallRuntimeDependencySet::Item,_std::default_delete<cmInstallRuntimeDependencySet::Item>_>,_std::allocator<std::unique_ptr<cmInstallRuntimeDependencySet::Item,_std::default_delete<cmInstallRuntimeDependencySet::Item>_>_>_>
                 *)keyword;
  keyword_local = (string_view *)os;
  os_local._4_4_ = indent.Level;
  std::__cxx11::string::string(local_58,(string *)config);
  (anonymous_namespace)::
  WriteMultiArgument<std::unique_ptr<cmInstallRuntimeDependencySet::Item,std::default_delete<cmInstallRuntimeDependencySet::Item>>,(anonymous_namespace)::WriteFilesArgument(std::ostream&,std::basic_string_view<char,std::char_traits<char>>const&,std::vector<std::unique_ptr<cmInstallRuntimeDependencySet::Item,std::default_delete<cmInstallRuntimeDependencySet::Item>>,std::allocator<std::unique_ptr<cmInstallRuntimeDependencySet::Item,std::default_delete<cmInstallRuntimeDependencySet::Item>>>>const&,std::__cxx11::string_const&,cmScriptGeneratorIndent)::__0>
            (os,keyword,items,local_34,(anon_class_32_1_50637480 *)local_58);
  (anonymous_namespace)::
  WriteFilesArgument(std::ostream&,std::basic_string_view<char,std::char_traits<char>>const&,std::vector<std::unique_ptr<cmInstallRuntimeDependencySet::Item,std::default_delete<cmInstallRuntimeDependencySet::Item>>,std::allocator<std::unique_ptr<cmInstallRuntimeDependencySet::Item,std::default_delete<cmInstallRuntimeDependencySet::Item>>>>const&,std::__cxx11::string_const&,cmScriptGeneratorIndent)
  ::$_0::~__0((__0 *)local_58);
  return;
}

Assistant:

void WriteFilesArgument(
  std::ostream& os, const cm::string_view& keyword,
  const std::vector<std::unique_ptr<cmInstallRuntimeDependencySet::Item>>&
    items,
  const std::string& config, cmScriptGeneratorIndent indent)
{
  WriteMultiArgument(
    os, keyword, items, indent,
    [config](const std::unique_ptr<cmInstallRuntimeDependencySet::Item>& i)
      -> std::string { return cmStrCat('"', i->GetItemPath(config), '"'); });
}